

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

Context * __thiscall
Hpipe::Context::with_string(Context *__return_storage_ptr__,Context *this,string *str)

{
  size_type sVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_38;
  
  Context(__return_storage_ptr__,this);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
          ::count(&__return_storage_ptr__->paths_to_strings,str);
  if (sVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar2 = std::operator<<(poVar2,(string *)str);
    poVar2 = std::operator<<(poVar2," is already in the context");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  range_vec<unsigned_int>
            ((Vec<unsigned_int> *)&_Stack_38,
             (uint)((ulong)((long)(this->pos).
                                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  .
                                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->pos).
                                 super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 .
                                 super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
  pvVar3 = &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
            ::operator[](&__return_storage_ptr__->paths_to_strings,str)->
            super_vector<unsigned_int,_std::allocator<unsigned_int>_>;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pvVar3,&_Stack_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

Context Context::with_string( const std::string &str ) const {
    Context res( *this );
    if ( res.paths_to_strings.count( str ) )
        std::cerr << "Error: " << str << " is already in the context" << std::endl;
    res.paths_to_strings[ str ] = range_vec( unsigned( pos.size() ) );
    return res;
}